

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O2

MPP_RET mpp_packet_add_segment_info(MppPacket packet,RK_S32 type,RK_S32 offset,RK_S32 len)

{
  void *pvVar1;
  uint uVar2;
  void *__dest;
  ulong uVar3;
  long lVar4;
  MPP_RET MVar5;
  uint uVar6;
  bool bVar7;
  
  uVar2 = *(uint *)((long)packet + 0x58);
  uVar6 = *(uint *)((long)packet + 0x5c);
  if (uVar2 < uVar6) {
    __dest = *(void **)((long)packet + 0x128);
    if (__dest == (void *)0x0) {
      __dest = (void *)((long)packet + 0x60);
      *(void **)((long)packet + 0x128) = __dest;
    }
LAB_0015bc8d:
    lVar4 = (ulong)uVar2 * 0x18;
    *(uint *)((long)__dest + lVar4) = uVar2;
    *(RK_S32 *)((long)__dest + lVar4 + 4) = type;
    *(RK_S32 *)((long)__dest + lVar4 + 8) = offset;
    *(RK_S32 *)((long)__dest + lVar4 + 0xc) = len;
    *(undefined8 *)((long)__dest + lVar4 + 0x10) = 0;
    if (uVar2 != 0) {
      *(void **)((long)__dest + lVar4 + -8) = (void *)((long)__dest + lVar4);
    }
    uVar2 = *(int *)((long)packet + 0x58) + 1;
    *(uint *)((long)packet + 0x58) = uVar2;
    MVar5 = MPP_OK;
    if (uVar6 < uVar2) {
      MVar5 = MPP_OK;
      _mpp_log_l(2,"mpp_packet","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "p->segment_nb <= p->segment_buf_cnt","mpp_packet_add_segment_info",0x22b);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
    }
  }
  else {
    uVar6 = uVar6 * 2;
    if (*(void **)((long)packet + 0x120) == (void *)0x0) {
      __dest = mpp_osal_calloc("mpp_packet_add_segment_info",(ulong)uVar6 * 0x18);
      if (__dest != (void *)0x0) {
        memcpy(__dest,(void *)((long)packet + 0x60),0xc0);
        goto LAB_0015bc5f;
      }
    }
    else {
      __dest = mpp_osal_realloc("mpp_packet_add_segment_info",*(void **)((long)packet + 0x120),
                                (ulong)uVar6 * 0x18);
      if (__dest != (void *)0x0) {
LAB_0015bc5f:
        uVar3 = (ulong)(uVar2 - 1);
        pvVar1 = __dest;
        while( true ) {
          bVar7 = uVar3 == 0;
          uVar3 = uVar3 - 1;
          if (bVar7) break;
          *(void **)((long)pvVar1 + 0x10) = (void *)((long)pvVar1 + 0x18);
          pvVar1 = (void *)((long)pvVar1 + 0x18);
        }
        *(void **)((long)packet + 0x120) = __dest;
        *(void **)((long)packet + 0x128) = __dest;
        *(uint *)((long)packet + 0x5c) = uVar6;
        goto LAB_0015bc8d;
      }
    }
    MVar5 = MPP_NOK;
  }
  return MVar5;
}

Assistant:

MPP_RET mpp_packet_add_segment_info(MppPacket packet, RK_S32 type, RK_S32 offset, RK_S32 len)
{
    MppPacketImpl *p = (MppPacketImpl *)packet;
    RK_U32 old_buf_cnt = p->segment_buf_cnt;
    RK_U32 segment_nb  = p->segment_nb;
    MppPktSeg *seg_buf = p->segments;

    if (segment_nb >= old_buf_cnt) {
        RK_U32 i;

        /* realloc segment info buffer. default 8 segments */
        old_buf_cnt *= 2;

        if (NULL == p->segments_ext) {
            seg_buf = mpp_calloc(MppPktSeg, old_buf_cnt);
            if (seg_buf)
                memcpy(seg_buf, p->segments_def, sizeof(p->segments_def));
        } else {
            seg_buf = mpp_realloc(p->segments_ext, MppPktSeg, old_buf_cnt);
        }

        if (NULL == seg_buf)
            return MPP_NOK;

        for (i = 0; i < segment_nb - 1; i++)
            seg_buf[i].next = &seg_buf[i + 1];

        p->segments_ext = seg_buf;
        p->segments = seg_buf;
        p->segment_buf_cnt = old_buf_cnt;
    } else {
        if (NULL == seg_buf) {
            seg_buf = p->segments_def;
            p->segments = seg_buf;
        }
    }

    mpp_assert(seg_buf);
    seg_buf += segment_nb;
    seg_buf->index  = segment_nb;
    seg_buf->type   = type;
    seg_buf->offset = offset;
    seg_buf->len    = len;
    seg_buf->next   = NULL;

    if (segment_nb)
        seg_buf[-1].next = seg_buf;

    p->segment_nb++;
    mpp_assert(p->segment_nb <= p->segment_buf_cnt);

    return MPP_OK;
}